

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall helics::apps::Player::loadTextFile(Player *this,string *filename)

{
  byte *pbVar1;
  pointer pMVar2;
  string_view bracketChars;
  undefined8 uVar3;
  bool bVar4;
  Time TVar5;
  ostream *poVar6;
  int *piVar7;
  undefined8 uVar8;
  char *pcVar9;
  pointer pVVar10;
  int iVar11;
  ulong uVar12;
  size_type sVar13;
  App *__src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  SmallBuffer *this_00;
  element_type *__n;
  initializer_list<char> __l;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view line;
  string_view whitespace;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view input_03;
  string_view input_04;
  string_view whitespace_00;
  string_view whitespace_01;
  string_view whitespace_02;
  string_view whitespace_03;
  string_view whitespace_04;
  string_view whitespace_05;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  int lineNumber;
  stringVector blk;
  vector<int,_std::allocator<int>_> cnts;
  string str;
  AppTextParser aparser;
  delimiter_compression in_stack_fffffffffffffb58;
  undefined1 local_4a0 [36];
  int local_47c;
  vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  stringVector local_460;
  undefined1 local_448 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  pointer local_410;
  string local_408 [3];
  ios_base local_390 [264];
  undefined1 local_288 [528];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  size_type sVar14;
  
  AppTextParser::AppTextParser((AppTextParser *)local_288,filename);
  local_4a0._0_2_ = 0x4d6d;
  __l._M_len = 2;
  __l._M_array = local_4a0;
  CLI::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_408,__l,(allocator_type *)local_448);
  AppTextParser::preParseFile
            ((vector<int,_std::allocator<int>_> *)&local_420,(AppTextParser *)local_288,
             (vector<char,_std::allocator<char>_> *)local_408);
  if (local_408[0]._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_408[0]._M_dataplus._M_p,
                    CONCAT71(local_408[0].field_2._M_allocated_capacity._1_7_,
                             local_408[0].field_2._M_local_buf[0]) -
                    (long)local_408[0]._M_dataplus._M_p);
  }
  lVar17 = (long)*(int *)(local_420._M_allocated_capacity + 8) +
           (long)*(int *)(local_420._M_allocated_capacity + 4);
  local_478 = &this->points;
  uVar19 = (long)(this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 7;
  CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::resize
            (local_478,((long)*(int *)local_420._M_allocated_capacity - (long)(int)lVar17) + uVar19)
  ;
  uVar8 = &this->messages;
  uVar12 = ((long)(this->messages).
                  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->messages).
                  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f;
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  resize((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)uVar8,
         lVar17 + uVar12);
  AppTextParser::reset((AppTextParser *)local_288);
  if (local_70 != 0) {
    apps::App::loadConfigOptions(&this->super_App,(AppTextParser *)local_288);
    generateParser((Player *)local_4a0);
    std::__cxx11::istringstream::istringstream((istringstream *)local_408,(string *)&local_78,_S_in)
    ;
    CLI::App::parse_from_stream((App *)local_4a0._0_8_,(istream *)local_408);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_408);
    std::ios_base::~ios_base(local_390);
    if ((App *)local_4a0._0_8_ != (App *)0x0) {
      (**(code **)(*(undefined8 *)local_4a0._0_8_ + 8))();
    }
  }
  local_408[0]._M_dataplus._M_p = (pointer)&local_408[0].field_2;
  local_408[0]._M_string_length = 0;
  local_408[0].field_2._M_local_buf[0] = '\0';
  local_470._M_allocated_capacity = uVar8;
  local_470._8_8_ = this;
  do {
    iVar18 = (int)uVar19;
    iVar11 = (int)uVar12;
    bVar4 = AppTextParser::loadNextLine((AppTextParser *)local_288,local_408,&local_47c);
    if (!bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408[0]._M_dataplus._M_p != &local_408[0].field_2) {
        operator_delete(local_408[0]._M_dataplus._M_p,
                        CONCAT71(local_408[0].field_2._M_allocated_capacity._1_7_,
                                 local_408[0].field_2._M_local_buf[0]) + 1);
      }
      if ((int *)local_420._M_allocated_capacity != (int *)0x0) {
        operator_delete((void *)local_420._M_allocated_capacity,(long)local_410 - local_420._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(local_288 + 8);
      return;
    }
    pcVar16 = (char *)0x0;
    bracketChars._M_str = (char *)0x447f45;
    bracketChars._M_len = 7;
    line._M_str = (char *)0x3;
    line._M_len = (size_t)local_408[0]._M_dataplus._M_p;
    pcVar9 = (char *)0x3;
    gmlc::utilities::stringOps::splitlineBracket_abi_cxx11_
              (&local_460,(stringOps *)local_408[0]._M_string_length,line,
               (string_view)ZEXT816(0x447e13),bracketChars,in_stack_fffffffffffffb58);
    whitespace._M_str = pcVar9;
    whitespace._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
    gmlc::utilities::stringOps::trimString
              ((stringOps *)
               local_460.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(string *)0x8,whitespace);
    pbVar1 = *(byte **)local_460.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    if ((*pbVar1 | 0x20) == 0x6d) {
      lVar17 = (long)local_460.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_460.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (lVar17 == 5) {
        str_02._M_str =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)local_460.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x20))->_M_dataplus)._M_p;
        str_02._M_len =
             *(size_t *)
              ((long)local_460.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x28);
        TVar5 = extractTime((Player *)local_470._8_8_,str_02,local_47c);
        pMVar2 = (((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                    *)uVar8)->
                 super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar2[iVar11].sendTime.internalTimeCode = TVar5.internalTimeCode;
        if (TVar5.internalTimeCode != -0x7fffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&pMVar2[iVar11].mess.source,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_460.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0x40));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&(((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                         *)uVar8)->
                      super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      )._M_impl.super__Vector_impl_data._M_start[iVar11].mess.dest,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_460.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0x60));
          pMVar2 = (((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)uVar8)->
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pMVar2[iVar11].mess.time.internalTimeCode = pMVar2[iVar11].sendTime.internalTimeCode;
          decode((string *)local_4a0,
                 (string *)
                 ((long)local_460.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x80));
          __n = (element_type *)local_4a0._8_8_;
          __src = (App *)local_4a0._0_8_;
          pMVar2 = (((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)uVar8)->
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          this_00 = &pMVar2[iVar11].mess.data;
          if ((App *)local_4a0._0_8_ == (App *)pMVar2[iVar11].mess.data.heap) {
LAB_00278e32:
            this_00->bufferSize = local_4a0._8_8_;
          }
          else {
            SmallBuffer::reserve(this_00,local_4a0._8_8_);
LAB_00278d3b:
            this_00->bufferSize = (size_t)__n;
            if (__n != (element_type *)0x0) {
              memcpy(this_00->heap,__src,(size_t)__n);
            }
          }
          uVar8 = local_470._M_allocated_capacity;
          if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
            operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
            uVar8 = local_470._M_allocated_capacity;
          }
          goto LAB_00278e62;
        }
      }
      else if (lVar17 == 6) {
        str_00._M_str =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)local_460.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x20))->_M_dataplus)._M_p;
        str_00._M_len =
             *(size_t *)
              ((long)local_460.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x28);
        TVar5 = extractTime((Player *)local_470._8_8_,str_00,local_47c);
        pMVar2 = (((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                    *)uVar8)->
                 super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar2[iVar11].sendTime.internalTimeCode = TVar5.internalTimeCode;
        if (TVar5.internalTimeCode != -0x7fffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&pMVar2[iVar11].mess.source,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_460.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0x60));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&(((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                         *)uVar8)->
                      super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      )._M_impl.super__Vector_impl_data._M_start[iVar11].mess.dest,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_460.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0x80));
          str_01._M_str =
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_460.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x40))->_M_dataplus)._M_p;
          str_01._M_len =
               *(size_t *)
                ((long)local_460.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x48);
          TVar5 = extractTime((Player *)local_470._8_8_,str_01,local_47c);
          (((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
           uVar8)->
          super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
          )._M_impl.super__Vector_impl_data._M_start[iVar11].mess.time.internalTimeCode =
               TVar5.internalTimeCode;
          if (TVar5.internalTimeCode != -0x7fffffffffffffff) {
            decode((string *)local_4a0,
                   (string *)
                   ((long)local_460.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0xa0));
            __n = (element_type *)local_4a0._8_8_;
            __src = (App *)local_4a0._0_8_;
            pMVar2 = (((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        *)uVar8)->
                     super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            this_00 = &pMVar2[iVar11].mess.data;
            if ((App *)local_4a0._0_8_ == (App *)pMVar2[iVar11].mess.data.heap) goto LAB_00278e32;
            SmallBuffer::reserve(this_00,local_4a0._8_8_);
            goto LAB_00278d3b;
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unknown message format line ",0x1c);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,local_47c);
        local_4a0[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4a0,1);
LAB_00278e62:
        uVar12 = (ulong)(iVar11 + 1);
      }
    }
    else {
      lVar17 = (long)local_460.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_460.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (lVar17 == 4) {
        sVar14 = *(size_type *)
                  ((long)local_460.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8);
        if (sVar14 == 0) {
LAB_00278f39:
          sVar13 = 0xffffffffffffffff;
        }
        else {
          do {
            sVar13 = sVar14 - 1;
            if (sVar14 == 0) goto LAB_00278f39;
            lVar17 = sVar14 - 1;
            sVar14 = sVar13;
          } while (pbVar1[lVar17] != 0x3a);
        }
        if (sVar13 == 0xffffffffffffffff) {
          input_03._M_str = (char *)0x8;
          input_03._M_len =
               *(size_t *)
                local_460.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          whitespace_04._M_str = pcVar16;
          whitespace_04._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,
                     *(stringOps **)
                      ((long)local_460.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8),input_03,whitespace_04);
          str_07._M_str = (char *)local_4a0._0_8_;
          str_07._M_len = local_4a0._8_8_;
          TVar5 = extractTime((Player *)local_470._8_8_,str_07,local_47c);
          uVar8 = local_470._M_allocated_capacity;
          (local_478->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[iVar18].time = (Time)TVar5.internalTimeCode;
          if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
            operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
          }
          if (TVar5.internalTimeCode != -0x7fffffffffffffff) goto LAB_00279417;
        }
        else {
          input_00._M_str = (char *)0x8;
          input_00._M_len =
               *(size_t *)
                local_460.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          whitespace_01._M_str = pcVar16;
          whitespace_01._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_448,
                     *(stringOps **)
                      ((long)local_460.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8),input_00,whitespace_01);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                     (string *)local_448,0,sVar13);
          str_04._M_str = (char *)local_4a0._0_8_;
          str_04._M_len = local_4a0._8_8_;
          TVar5 = extractTime((Player *)local_470._8_8_,str_04,local_47c);
          (local_478->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[iVar18].time = (Time)TVar5.internalTimeCode;
          if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
            operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
          }
          if ((App *)local_448._0_8_ != (App *)(local_448 + 0x10)) {
            operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
          }
          uVar8 = local_470._M_allocated_capacity;
          if (TVar5.internalTimeCode != -0x7fffffffffffffff) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a0,
                       local_460.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,sVar13 + 1,0xffffffffffffffff);
            uVar8 = local_4a0._0_8_;
            piVar7 = __errno_location();
            iVar11 = *piVar7;
            *piVar7 = 0;
            lVar17 = strtol((char *)uVar8,(char **)local_448,10);
            if (local_448._0_8_ == uVar8) goto LAB_0027978d;
            if ((lVar17 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) {
              std::__throw_out_of_range("stoi");
              goto LAB_00279769;
            }
            if (*piVar7 == 0) {
              *piVar7 = iVar11;
            }
            *(int *)((long)((local_478->
                            super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                            )._M_impl.super__Vector_impl_data._M_start + iVar18) + 8) = (int)lVar17;
            uVar8 = local_470._M_allocated_capacity;
            if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
              operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
              uVar8 = local_470._M_allocated_capacity;
            }
LAB_00279417:
            if ((*(size_t *)
                  ((long)local_460.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x28) == 0) && (0 < iVar18)) {
              pVVar10 = (local_478->
                        super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar17 = (uVar19 & 0xffffffff) * 0x80;
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)(pVVar10 + (uVar19 & 0xffffffff) + 0xffffffffffffffff) + 0x30);
            }
            else {
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)local_460.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x20);
              pVVar10 = (local_478->
                        super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar17 = (long)iVar18 << 7;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&pVVar10->pubName + lVar17),pbVar15);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)((local_478->
                              super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                              )._M_impl.super__Vector_impl_data._M_start + iVar18) + 0x10),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)local_460.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x40));
            decode((string *)local_4a0,
                   (string *)
                   ((long)local_460.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x60));
            pVVar10 = (local_478->
                      super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      )._M_impl.super__Vector_impl_data._M_start + iVar18;
LAB_002795e4:
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         *)&pVVar10->value,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4a0);
            if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
              operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
            }
            uVar19 = (ulong)(iVar18 + 1);
          }
        }
      }
      else if (lVar17 == 3) {
        sVar14 = *(size_type *)
                  ((long)local_460.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8);
        if (sVar14 == 0) {
LAB_00278e69:
          sVar13 = 0xffffffffffffffff;
        }
        else {
          do {
            sVar13 = sVar14 - 1;
            if (sVar14 == 0) goto LAB_00278e69;
            lVar17 = sVar14 - 1;
            sVar14 = sVar13;
          } while (pbVar1[lVar17] != 0x3a);
        }
        if (sVar13 == 0xffffffffffffffff) {
          input_02._M_str = (char *)0x8;
          input_02._M_len =
               *(size_t *)
                local_460.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          whitespace_03._M_str = pcVar16;
          whitespace_03._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,
                     *(stringOps **)
                      ((long)local_460.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8),input_02,whitespace_03);
          str_06._M_str = (char *)local_4a0._0_8_;
          str_06._M_len = local_4a0._8_8_;
          TVar5 = extractTime((Player *)local_470._8_8_,str_06,local_47c);
          uVar8 = local_470._M_allocated_capacity;
          (local_478->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[iVar18].time = (Time)TVar5.internalTimeCode;
          if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
            operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
          }
          if (TVar5.internalTimeCode != -0x7fffffffffffffff) {
LAB_00279324:
            if ((*(size_t *)
                  ((long)local_460.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x28) == 0) && (0 < iVar18)) {
              pVVar10 = (local_478->
                        super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar17 = (uVar19 & 0xffffffff) * 0x80;
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)(pVVar10 + (uVar19 & 0xffffffff) + 0xffffffffffffffff) + 0x30);
            }
            else {
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)local_460.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x20);
              pVVar10 = (local_478->
                        super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar17 = (long)iVar18 << 7;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&pVVar10->pubName + lVar17),pbVar15);
            decode((string *)local_4a0,
                   (string *)
                   ((long)local_460.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x40));
            pVVar10 = (local_478->
                      super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      )._M_impl.super__Vector_impl_data._M_start + iVar18;
            goto LAB_002795e4;
          }
        }
        else {
          input._M_str = (char *)0x8;
          input._M_len = *(size_t *)
                          local_460.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          whitespace_00._M_str = pcVar16;
          whitespace_00._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_448,
                     *(stringOps **)
                      ((long)local_460.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8),input,whitespace_00);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                     (string *)local_448,0,sVar13);
          str_03._M_str = (char *)local_4a0._0_8_;
          str_03._M_len = local_4a0._8_8_;
          TVar5 = extractTime((Player *)local_470._8_8_,str_03,local_47c);
          (local_478->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[iVar18].time = (Time)TVar5.internalTimeCode;
          if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
            operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
          }
          if ((App *)local_448._0_8_ != (App *)(local_448 + 0x10)) {
            operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
          }
          uVar8 = local_470._M_allocated_capacity;
          if (TVar5.internalTimeCode != -0x7fffffffffffffff) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a0,
                       local_460.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,sVar13 + 1,0xffffffffffffffff);
            uVar8 = local_4a0._0_8_;
            piVar7 = __errno_location();
            iVar11 = *piVar7;
            *piVar7 = 0;
            lVar17 = strtol((char *)uVar8,(char **)local_448,10);
            if (local_448._0_8_ == uVar8) {
LAB_00279769:
              std::__throw_invalid_argument("stoi");
            }
            else if ((0xfffffffeffffffff < lVar17 - 0x80000000U) && (*piVar7 != 0x22)) {
              if (*piVar7 == 0) {
                *piVar7 = iVar11;
              }
              *(int *)((long)((local_478->
                              super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                              )._M_impl.super__Vector_impl_data._M_start + iVar18) + 8) =
                   (int)lVar17;
              uVar8 = local_470._M_allocated_capacity;
              if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
                operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
                uVar8 = local_470._M_allocated_capacity;
              }
              goto LAB_00279324;
            }
            std::__throw_out_of_range("stoi");
LAB_00279781:
            std::__throw_out_of_range("stoi");
LAB_0027978d:
            std::__throw_invalid_argument("stoi");
LAB_00279799:
            uVar8 = std::__throw_invalid_argument("stoi");
            std::__cxx11::istringstream::~istringstream((istringstream *)local_408);
            std::ios_base::~ios_base(local_390);
            if ((App *)local_4a0._0_8_ != (App *)0x0) {
              (**(code **)(*(undefined8 *)local_4a0._0_8_ + 8))();
            }
            local_4a0._0_8_ = (_func_int **)0x0;
            if ((int *)local_420._M_allocated_capacity != (int *)0x0) {
              operator_delete((void *)local_420._M_allocated_capacity,
                              (long)local_410 - local_420._0_8_);
            }
            AppTextParser::~AppTextParser((AppTextParser *)local_288);
            _Unwind_Resume(uVar8);
          }
        }
      }
      else if (lVar17 == 2) {
        sVar14 = *(size_type *)
                  ((long)local_460.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8);
        if (sVar14 == 0) {
LAB_0027900f:
          sVar13 = 0xffffffffffffffff;
        }
        else {
          do {
            sVar13 = sVar14 - 1;
            if (sVar14 == 0) goto LAB_0027900f;
            lVar17 = sVar14 - 1;
            sVar14 = sVar13;
          } while (pbVar1[lVar17] != 0x3a);
        }
        local_448._32_8_ = SEXT48(iVar18);
        if (sVar13 == 0xffffffffffffffff) {
          input_04._M_str = (char *)0x8;
          input_04._M_len =
               *(size_t *)
                local_460.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          whitespace_05._M_str = pcVar16;
          whitespace_05._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,
                     *(stringOps **)
                      ((long)local_460.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8),input_04,whitespace_05);
          str_08._M_str = (char *)local_4a0._0_8_;
          str_08._M_len = local_4a0._8_8_;
          TVar5 = extractTime((Player *)local_470._8_8_,str_08,local_47c);
          uVar8 = local_470._M_allocated_capacity;
          (local_478->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[local_448._32_8_].time =
               (Time)TVar5.internalTimeCode;
          if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
            operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
          }
          if (TVar5.internalTimeCode != -0x7fffffffffffffff) {
LAB_00279502:
            if (iVar18 < 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "lines without publication name but follow one with a publication line ",
                         0x46);
              poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,local_47c);
              local_4a0[0] = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4a0,1);
            }
            else {
              pVVar10 = (local_478->
                        super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)(pVVar10 + (uVar19 & 0xffffffff)) + 0x30),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)(pVVar10 + (uVar19 & 0xffffffff) + 0xffffffffffffffff) + 0x30));
            }
            decode((string *)local_4a0,
                   (string *)
                   ((long)local_460.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x20));
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         *)((long)((local_478->
                                   super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                   )._M_impl.super__Vector_impl_data._M_start + local_448._32_8_) +
                           0x50),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4a0);
            if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
              operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
            }
            uVar19 = (ulong)(iVar18 + 1);
          }
        }
        else {
          input_01._M_str = (char *)0x8;
          input_01._M_len =
               *(size_t *)
                local_460.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          whitespace_02._M_str = pcVar16;
          whitespace_02._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_448,
                     *(stringOps **)
                      ((long)local_460.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8),input_01,whitespace_02);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                     (string *)local_448,0,sVar13);
          str_05._M_str = (char *)local_4a0._0_8_;
          str_05._M_len = local_4a0._8_8_;
          TVar5 = extractTime((Player *)local_470._8_8_,str_05,local_47c);
          uVar3 = local_448._32_8_;
          (local_478->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[local_448._32_8_].time =
               (Time)TVar5.internalTimeCode;
          if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
            operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
          }
          if ((App *)local_448._0_8_ != (App *)(local_448 + 0x10)) {
            operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
          }
          uVar8 = local_470._M_allocated_capacity;
          if (TVar5.internalTimeCode != -0x7fffffffffffffff) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a0,
                       local_460.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,sVar13 + 1,0xffffffffffffffff);
            uVar8 = local_4a0._0_8_;
            piVar7 = __errno_location();
            iVar11 = *piVar7;
            *piVar7 = 0;
            lVar17 = strtol((char *)uVar8,(char **)local_448,10);
            if (local_448._0_8_ == uVar8) goto LAB_00279799;
            if ((0xfffffffeffffffff < lVar17 - 0x80000000U) && (*piVar7 != 0x22)) {
              if (*piVar7 == 0) {
                *piVar7 = iVar11;
              }
              *(int *)((long)((local_478->
                              super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar3) + 8) = (int)lVar17
              ;
              uVar8 = local_470._M_allocated_capacity;
              if ((App *)local_4a0._0_8_ != (App *)(local_4a0 + 0x10)) {
                operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
                uVar8 = local_470._M_allocated_capacity;
              }
              goto LAB_00279502;
            }
            goto LAB_00279781;
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unknown publish format line ",0x1c);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,local_47c);
        local_4a0[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4a0,1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_460);
  } while( true );
}

Assistant:

void Player::loadTextFile(const std::string& filename)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT

    AppTextParser aparser(filename);
    auto cnts = aparser.preParseFile({'m', 'M'});

    int mcnt = cnts[1] + cnts[2];
    int pcnt = cnts[0] - mcnt;
    int pIndex = static_cast<int>(points.size());
    points.resize(points.size() + pcnt);
    int mIndex = static_cast<int>(messages.size());
    messages.resize(messages.size() + mcnt);

    aparser.reset();

    if (!aparser.configString().empty()) {
        App::loadConfigOptions(aparser);
        auto app = generateParser();
        std::istringstream sstr(aparser.configString());
        app->parse_from_stream(sstr);
    }
    std::string str;
    int lineNumber;
    while (aparser.loadNextLine(str, lineNumber)) {
        /* time key type value units*/
        auto blk = splitlineBracket(str, ",\t ", default_bracket_chars, delimiter_compression::on);

        trimString(blk[0]);
        if ((blk[0].front() == 'm') || (blk[0].front() == 'M')) {
            // deal with messages
            switch (blk.size()) {
                case 5:
                    if ((messages[mIndex].sendTime = extractTime(blk[1], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }

                    messages[mIndex].mess.source = blk[2];
                    messages[mIndex].mess.dest = blk[3];
                    messages[mIndex].mess.time = messages[mIndex].sendTime;
                    messages[mIndex].mess.data = decode(std::move(blk[4]));
                    break;
                case 6:
                    if ((messages[mIndex].sendTime = extractTime(blk[1], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }

                    messages[mIndex].mess.source = blk[3];
                    messages[mIndex].mess.dest = blk[4];
                    if ((messages[mIndex].mess.time = extractTime(blk[2], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                    messages[mIndex].mess.data = decode(std::move(blk[5]));
                    break;
                default:
                    std::cerr << "unknown message format line " << lineNumber << '\n';
                    break;
            }
            ++mIndex;
        } else {
            if (blk.size() == 2) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if (pIndex > 0) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    std::cerr
                        << "lines without publication name but follow one with a publication line "
                        << lineNumber << '\n';
                }
                points[pIndex].value = decode(std::move(blk[1]));
                ++pIndex;
            } else if (blk.size() == 3) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if ((blk[1].empty()) && (pIndex > 0)) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    points[pIndex].pubName = blk[1];
                }

                points[pIndex].value = decode(std::move(blk[2]));
                ++pIndex;
            } else if (blk.size() == 4) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if ((blk[1].empty()) && (pIndex > 0)) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    points[pIndex].pubName = blk[1];
                }
                points[pIndex].type = blk[2];
                points[pIndex].value = decode(std::move(blk[3]));
                ++pIndex;
            } else {
                std::cerr << "unknown publish format line " << lineNumber << '\n';
            }
        }
    }
}